

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

void Assimp::FindAABBTransformed(aiMesh *mesh,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  uint i;
  ulong uVar1;
  long lVar2;
  aiVector3t<float> aVar3;
  aiVector3t<float> local_40;
  
  min->x = 1e+11;
  min->y = 1e+11;
  min->z = 1e+11;
  max->x = -1e+11;
  max->y = -1e+11;
  max->z = -1e+11;
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < mesh->mNumVertices; uVar1 = uVar1 + 1) {
    local_40 = operator*(m,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar2));
    aVar3 = std::min<float>(&local_40,min);
    min->x = aVar3.x;
    min->y = aVar3.y;
    min->z = aVar3.z;
    aVar3 = std::max<float>(&local_40,max);
    max->x = aVar3.x;
    max->y = aVar3.y;
    max->z = aVar3.z;
    lVar2 = lVar2 + 0xc;
  }
  return;
}

Assistant:

void FindAABBTransformed (const aiMesh* mesh, aiVector3D& min, aiVector3D& max,
    const aiMatrix4x4& m)
{
    min = aiVector3D ( ai_real( 10e10 ), ai_real( 10e10 ), ai_real( 10e10 ) );
    max = aiVector3D ( ai_real( -10e10 ), ai_real( -10e10 ), ai_real( -10e10 ) );
    for (unsigned int i = 0;i < mesh->mNumVertices;++i)
    {
        const aiVector3D v = m * mesh->mVertices[i];
        min = std::min(v,min);
        max = std::max(v,max);
    }
}